

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_internal.h
# Opt level: O0

void __thiscall
google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>::Swap
          (RepeatedFieldPrimitiveAccessor<bool> *this,Field *data,
          RepeatedFieldAccessor *other_mutator,Field *other_data)

{
  LogMessage *other;
  RepeatedFieldType *this_00;
  RepeatedFieldType *other_00;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Field *local_28;
  Field *other_data_local;
  RepeatedFieldAccessor *other_mutator_local;
  Field *data_local;
  RepeatedFieldPrimitiveAccessor<bool> *this_local;
  
  local_61 = 0;
  local_28 = other_data;
  other_data_local = other_mutator;
  other_mutator_local = (RepeatedFieldAccessor *)data;
  data_local = this;
  if ((RepeatedFieldAccessor *)this != other_mutator) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/reflection_internal.h"
               ,0x11f);
    local_61 = 1;
    other = LogMessage::operator<<(&local_60,"CHECK failed: this == other_mutator: ");
    LogFinisher::operator=(local_75,other);
  }
  if ((local_61 & 1) != 0) {
    LogMessage::~LogMessage(&local_60);
  }
  this_00 = RepeatedFieldWrapper<bool>::MutableRepeatedField(other_mutator_local);
  other_00 = RepeatedFieldWrapper<bool>::MutableRepeatedField(local_28);
  RepeatedField<bool>::Swap(this_00,other_00);
  return;
}

Assistant:

virtual void Swap(
      Field* data,
      const internal::RepeatedFieldAccessor* other_mutator,
      Field* other_data) const {
    // Currently RepeatedFieldPrimitiveAccessor is the only implementation of
    // RepeatedFieldAccessor for primitive types. As we are using singletons
    // for these accessors, here "other_mutator" must be "this".
    GOOGLE_CHECK(this == other_mutator);
    MutableRepeatedField(data)->Swap(MutableRepeatedField(other_data));
  }